

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteConcat(Bac_Ntk_t *p,int iStart,int nObjs)

{
  char cVar1;
  uint uVar2;
  Vec_Str_t *p_00;
  int *piVar3;
  size_t sVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  int i_3;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar16;
  int i_2;
  int i;
  uint uVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  ulong local_40;
  ulong uVar15;
  
  if (nObjs < 1) {
    __assert_fail("nObjs >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x11e,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  if (nObjs == 1) {
    Bac_ManWriteSig(p,iStart);
    return;
  }
  p_00 = p->pDesign->vOut;
  uVar6 = p_00->nSize;
  if (uVar6 == p_00->nCap) {
    if ((int)uVar6 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar10 = (char *)malloc(0x10);
      }
      else {
        pcVar10 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar10;
      p_00->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar6 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar10 = (char *)malloc(sVar4);
      }
      else {
        pcVar10 = (char *)realloc(p_00->pArray,sVar4);
      }
      p_00->pArray = pcVar10;
      p_00->nCap = (int)sVar4;
    }
  }
  else {
    pcVar10 = p_00->pArray;
  }
  iVar11 = p_00->nSize;
  p_00->nSize = iVar11 + 1;
  pcVar10[iVar11] = '{';
  if ((iStart < 0) || ((p->vType).nSize <= iStart)) {
LAB_003a22d2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  bVar5 = (p->vType).pArray[(uint)iStart] & 0xfe;
  if (bVar5 == 6) {
    uVar6 = iStart + 1;
    uVar16 = (ulong)(uVar6 - nObjs);
    if ((int)(uVar6 - nObjs) <= iStart) {
LAB_003a1829:
      if ((long)p_00->nSize < 1) goto LAB_003a236d;
      if (p_00->pArray[(long)p_00->nSize + -1] != '{') {
        lVar19 = 0;
        do {
          cVar1 = "    \"%s\", "[lVar19 + 8];
          uVar7 = p_00->nSize;
          if (uVar7 == p_00->nCap) {
            if ((int)uVar7 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar7 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar4);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,sVar4);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = (int)sVar4;
            }
          }
          else {
            pcVar10 = p_00->pArray;
          }
          iVar11 = p_00->nSize;
          p_00->nSize = iVar11 + 1;
          pcVar10[iVar11] = cVar1;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 2);
      }
      iVar11 = (int)uVar16;
      if (iVar11 < 0) goto LAB_003a22d2;
      uVar7 = (p->vType).nSize;
      if ((int)uVar7 <= iVar11) goto LAB_003a22d2;
      pcVar10 = (p->vType).pArray;
      if ((pcVar10[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
      uVar14 = (p->vFanin).nSize;
      if ((int)uVar14 <= iVar11) goto LAB_003a2310;
      piVar3 = (p->vFanin).pArray;
      uVar2 = piVar3[uVar16];
      lVar19 = (long)(int)uVar2;
      if ((lVar19 < 0) || (uVar7 <= uVar2)) goto LAB_003a22d2;
      bVar5 = pcVar10[lVar19];
      if ((9 < bVar5) || ((0x30cU >> (bVar5 & 0x1f) & 1) == 0)) {
LAB_003a23ab:
        __assert_fail("Bac_ObjIsCi(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x12e,"int Bac_ObjGetConst(Bac_Ntk_t *, int)");
      }
      if ((bVar5 & 0xfe) == 8) {
        if (uVar7 <= uVar2 - 1) goto LAB_003a22d2;
        if ((byte)(pcVar10[uVar2 - 1] - 0x14U) < 0xf8) goto LAB_003a1973;
        bVar20 = (pcVar10[lVar19 + -1] & 0xfcU) == 0xc;
        uVar13 = (ulong)(iVar11 + 1);
        uVar15 = uVar13;
        local_40 = uVar16;
        if (iVar11 < iStart) {
          bVar20 = (pcVar10[lVar19 + -1] & 0xfcU) == 0xc;
          do {
            if (((int)local_40 < -1) || (uVar7 <= uVar13)) goto LAB_003a22d2;
            if ((pcVar10[uVar13] & 0xfcU) != 4) goto LAB_003a22f1;
            if (uVar14 <= uVar13) goto LAB_003a2310;
            uVar2 = piVar3[uVar13];
            lVar19 = (long)(int)uVar2;
            if ((lVar19 < 0) || (uVar7 <= uVar2)) goto LAB_003a22d2;
            bVar5 = pcVar10[lVar19];
            if ((9 < bVar5) || ((0x30cU >> (bVar5 & 0x1f) & 1) == 0)) goto LAB_003a23ab;
            uVar18 = (int)local_40 + 1;
            uVar15 = (ulong)uVar18;
            if ((bVar5 & 0xfe) != 8) goto LAB_003a1e10;
            if (uVar7 <= uVar2 - 1) goto LAB_003a22d2;
            if ((byte)(pcVar10[uVar2 - 1] - 0x14U) < 0xf8) goto LAB_003a1e10;
            if ((pcVar10[lVar19 + -1] & 0xfcU) != 0xc) {
              bVar20 = false;
            }
            uVar13 = uVar13 + 1;
            local_40 = uVar15;
          } while ((int)uVar18 < iStart);
          uVar15 = (ulong)uVar6;
          local_40 = (ulong)(uint)iStart;
        }
LAB_003a1e10:
        uVar7 = (int)uVar15 - iVar11;
        Vec_StrPrintNum(p_00,uVar7);
        iVar9 = (int)local_40;
        if ((bVar20) && (8 < (int)uVar7)) {
          uVar7 = uVar7 & 3;
          lVar19 = 0;
          do {
            cVar1 = "  Node%d [label = \"%d:%d\'h"[lVar19 + 0x18];
            uVar14 = p_00->nSize;
            if (uVar14 == p_00->nCap) {
              if ((int)uVar14 < 0x10) {
                if (p_00->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(0x10);
                }
                else {
                  pcVar10 = (char *)realloc(p_00->pArray,0x10);
                }
                p_00->pArray = pcVar10;
                p_00->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar14 * 2;
                if (p_00->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(sVar4);
                }
                else {
                  pcVar10 = (char *)realloc(p_00->pArray,sVar4);
                }
                p_00->pArray = pcVar10;
                p_00->nCap = (int)sVar4;
              }
            }
            else {
              pcVar10 = p_00->pArray;
            }
            iVar8 = p_00->nSize;
            p_00->nSize = iVar8 + 1;
            pcVar10[iVar8] = cVar1;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
          if (iVar9 < iVar11) {
            if (uVar7 != 0) goto LAB_003a2408;
            goto LAB_003a223d;
          }
          uVar14 = (p->vType).nSize;
          if (iVar11 < (int)uVar14) {
            if (uVar7 == 0) {
              uVar7 = 4;
            }
            iVar11 = 0;
            do {
              pcVar10 = (p->vType).pArray;
              if ((pcVar10[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
              iVar8 = (int)uVar16;
              if ((p->vFanin).nSize <= iVar8) goto LAB_003a2310;
              uVar2 = (p->vFanin).pArray[uVar16];
              if (((long)(int)uVar2 < 0) || (uVar14 <= uVar2)) break;
              bVar5 = pcVar10[(int)uVar2];
              if ((9 < bVar5) || ((0x30cU >> (bVar5 & 0x1f) & 1) == 0)) goto LAB_003a23ab;
              uVar18 = 0;
              if ((bVar5 & 0xfe) == 8) {
                if (uVar14 <= uVar2 - 1) break;
                if (0xf7 < (byte)(pcVar10[uVar2 - 1] - 0x14U)) {
                  uVar18 = (uint)((byte)pcVar10[uVar2 - 1] >> 1);
                }
              }
              iVar11 = uVar18 + iVar11;
              if (0x15 < iVar11) {
                __assert_fail("Digit < 16",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x14b,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
              }
              uVar7 = uVar7 - 1;
              if (uVar7 == 0) {
                cVar1 = (char)iVar11 + '*';
                if (0xf < iVar11) {
                  cVar1 = (char)iVar11 + 'Q';
                }
                uVar7 = p_00->nSize;
                if (uVar7 == p_00->nCap) {
                  if ((int)uVar7 < 0x10) {
                    if (p_00->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar10 = (char *)realloc(p_00->pArray,0x10);
                    }
                    p_00->pArray = pcVar10;
                    p_00->nCap = 0x10;
                  }
                  else {
                    sVar4 = (ulong)uVar7 * 2;
                    if (p_00->pArray == (char *)0x0) {
                      pcVar10 = (char *)malloc(sVar4);
                    }
                    else {
                      pcVar10 = (char *)realloc(p_00->pArray,sVar4);
                    }
                    p_00->pArray = pcVar10;
                    p_00->nCap = (int)sVar4;
                  }
                }
                else {
                  pcVar10 = p_00->pArray;
                }
                iVar11 = p_00->nSize;
                p_00->nSize = iVar11 + 1;
                pcVar10[iVar11] = cVar1;
                if (iVar9 <= iVar8) goto LAB_003a223d;
                iVar11 = 0;
                uVar7 = 4;
              }
              else {
                iVar11 = iVar11 + -6;
                if (iVar9 <= iVar8) goto LAB_003a216b;
              }
              uVar16 = uVar16 + 1;
              iVar11 = iVar11 * 2;
              uVar14 = (p->vType).nSize;
              if ((int)uVar14 <= (int)uVar16) break;
            } while( true );
          }
          goto LAB_003a22d2;
        }
        lVar19 = 0;
        do {
          cVar1 = "1\'b"[lVar19 + 1];
          uVar7 = p_00->nSize;
          if (uVar7 == p_00->nCap) {
            if ((int)uVar7 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar7 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar4);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,sVar4);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = (int)sVar4;
            }
          }
          else {
            pcVar10 = p_00->pArray;
          }
          iVar8 = p_00->nSize;
          p_00->nSize = iVar8 + 1;
          pcVar10[iVar8] = cVar1;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 2);
        if (iVar11 <= iVar9) {
          do {
            iVar11 = (int)uVar16;
            if ((p->vType).nSize <= iVar11) goto LAB_003a22d2;
            if (((p->vType).pArray[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
            if ((p->vFanin).nSize <= iVar11) goto LAB_003a2310;
            Bac_ManWriteConstBit(p,(p->vFanin).pArray[uVar16],0);
            uVar16 = uVar16 + 1;
          } while (iVar11 < iVar9);
        }
      }
      else {
LAB_003a1973:
        uVar12 = iVar11 + 1;
        uVar18 = uVar12;
        if (iVar11 < iStart) {
          uVar13 = (ulong)uVar12;
          uVar15 = uVar16;
          do {
            if (uVar7 <= uVar13) goto LAB_003a22d2;
            if ((pcVar10[uVar13] & 0xfcU) != 4) goto LAB_003a22f1;
            if (uVar14 <= uVar13) goto LAB_003a2310;
            if (piVar3[uVar13] != uVar2) {
              uVar18 = (int)uVar15 + 1;
              break;
            }
            uVar13 = uVar13 + 1;
            uVar17 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar17;
            uVar18 = uVar6;
          } while ((int)uVar17 < iStart);
        }
        if (iVar11 + 2 < (int)uVar18) {
          Vec_StrPrintNum(p_00,uVar18 - iVar11);
          uVar7 = p_00->nSize;
          if (uVar7 == p_00->nCap) {
            if ((int)uVar7 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar7 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar4);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,sVar4);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = (int)sVar4;
            }
          }
          else {
            pcVar10 = p_00->pArray;
          }
          iVar9 = p_00->nSize;
          p_00->nSize = iVar9 + 1;
          pcVar10[iVar9] = '{';
          Bac_ManWriteSig(p,iVar11);
          uVar7 = p_00->nSize;
          if (uVar7 == p_00->nCap) {
            if ((int)uVar7 < 0x10) {
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,0x10);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = 0x10;
            }
            else {
              sVar4 = (ulong)uVar7 * 2;
              if (p_00->pArray == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar4);
              }
              else {
                pcVar10 = (char *)realloc(p_00->pArray,sVar4);
              }
              p_00->pArray = pcVar10;
              p_00->nCap = (int)sVar4;
            }
          }
          else {
            pcVar10 = p_00->pArray;
          }
          iVar11 = p_00->nSize;
          p_00->nSize = iVar11 + 1;
          pcVar10[iVar11] = '}';
          uVar15 = (ulong)uVar18;
        }
        else {
          uVar7 = Bac_ObjName(p,uVar2);
          if (uVar7 == 0) goto LAB_003a232f;
          if ((int)uVar7 < 0) goto LAB_003a234e;
          if ((uVar7 & 3) == 0) {
            Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
          }
          else {
            iVar9 = (p->vType).nSize;
            uVar7 = uVar12;
            if (iVar11 < iStart) {
              if (iVar9 <= iVar11) goto LAB_003a22d2;
              pcVar10 = (p->vType).pArray;
              if ((pcVar10[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
              iVar8 = (p->vFanin).nSize;
              if (iVar8 <= iVar11) goto LAB_003a2310;
              piVar3 = (p->vFanin).pArray;
              lVar19 = 0;
              uVar15 = uVar16;
              do {
                uVar7 = (int)uVar15 + 1;
                if (iVar9 <= (int)uVar7) goto LAB_003a22d2;
                if ((pcVar10[lVar19 + (ulong)uVar12] & 0xfcU) != 4) goto LAB_003a22f1;
                if (iVar8 <= (int)uVar7) goto LAB_003a2310;
                if ((int)lVar19 + 1 != piVar3[uVar16] - piVar3[(ulong)uVar12 + lVar19]) break;
                uVar14 = (int)uVar15 + 1;
                uVar15 = (ulong)uVar14;
                lVar19 = lVar19 + 1;
                uVar7 = uVar6;
              } while ((int)uVar14 < iStart);
            }
            if (iVar9 <= iVar11) goto LAB_003a22d2;
            if (((p->vType).pArray[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
            if ((p->vFanin).nSize <= iVar11) {
LAB_003a2310:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Bac_ManFindRealNameId(p,(p->vFanin).pArray[uVar16]);
            Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
            iVar9 = (p->vType).nSize;
            if (uVar7 != uVar12) {
              if (iVar9 < (int)uVar7) goto LAB_003a22d2;
              if (((p->vType).pArray[uVar7 - 1] & 0xfcU) != 4) goto LAB_003a22f1;
              if ((p->vFanin).nSize < (int)uVar7) goto LAB_003a2310;
              iVar9 = (p->vFanin).pArray[uVar7 - 1];
              uVar14 = Bac_ObjName(p,iVar9);
              if (uVar14 == 0) goto LAB_003a232f;
              if ((int)uVar14 < 0) goto LAB_003a234e;
              if ((uVar14 & 3) == 0) {
                __assert_fail("Bac_ObjNameType(p, f) != BAC_NAME_BIN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x17f,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
              }
              uVar14 = Bac_ObjName(p,iVar9);
              if (uVar14 == 0) goto LAB_003a232f;
              if ((int)uVar14 < 0) goto LAB_003a234e;
              uVar15 = (ulong)uVar7;
              if (((~uVar14 & 3) != 0) &&
                 (iVar8 = Bac_ObjGetRange(p,iVar9), iVar8 == uVar7 - iVar11)) goto LAB_003a223d;
              iVar9 = Bac_ManFindRealIndex(p,iVar9);
              if ((p->vType).nSize <= iVar11) goto LAB_003a22d2;
              if (((p->vType).pArray[uVar16] & 0xfcU) != 4) goto LAB_003a22f1;
              if ((p->vFanin).nSize <= iVar11) goto LAB_003a2310;
              iVar11 = Bac_ManFindRealIndex(p,(p->vFanin).pArray[uVar16]);
              Bac_ManWriteRange((Bac_Ntk_t *)p->pDesign->vOut,iVar9,iVar11);
              goto LAB_003a223d;
            }
            if (iVar9 <= iVar11) goto LAB_003a22d2;
            if (((p->vType).pArray[uVar16] & 0xfcU) != 4) {
LAB_003a22f1:
              __assert_fail("Bac_ObjIsCo(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                            ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
            }
            if ((p->vFanin).nSize <= iVar11) goto LAB_003a2310;
            iVar11 = Bac_ManFindRealIndex(p,(p->vFanin).pArray[uVar16]);
            Bac_ManWriteRange((Bac_Ntk_t *)p->pDesign->vOut,iVar11,-1);
          }
          uVar15 = (ulong)uVar12;
        }
      }
LAB_003a223d:
      uVar16 = uVar15;
      if (iStart < (int)uVar16) goto LAB_003a2250;
      goto LAB_003a1829;
    }
  }
  else {
    if (bVar5 != 8) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x187,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
    }
    iVar11 = nObjs + iStart;
    do {
      iVar11 = iVar11 + -1;
      uVar6 = Bac_ObjName(p,iVar11);
      if (uVar6 == 0) {
LAB_003a232f:
        __assert_fail("n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                      ,0x107,"Bac_NameType_t Bac_NameType(int)");
      }
      if ((int)uVar6 < 0) {
LAB_003a234e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x13e,"int Abc_Lit2Att2(int)");
      }
      if ((~uVar6 & 3) != 0) {
        if ((long)p_00->nSize < 1) {
LAB_003a236d:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x197,"char Vec_StrEntryLast(Vec_Str_t *)");
        }
        if (p_00->pArray[(long)p_00->nSize + -1] != '{') {
          lVar19 = 0;
          do {
            cVar1 = "    \"%s\", "[lVar19 + 8];
            uVar6 = p_00->nSize;
            if (uVar6 == p_00->nCap) {
              if ((int)uVar6 < 0x10) {
                if (p_00->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(0x10);
                }
                else {
                  pcVar10 = (char *)realloc(p_00->pArray,0x10);
                }
                p_00->pArray = pcVar10;
                p_00->nCap = 0x10;
              }
              else {
                sVar4 = (ulong)uVar6 * 2;
                if (p_00->pArray == (char *)0x0) {
                  pcVar10 = (char *)malloc(sVar4);
                }
                else {
                  pcVar10 = (char *)realloc(p_00->pArray,sVar4);
                }
                p_00->pArray = pcVar10;
                p_00->nCap = (int)sVar4;
              }
            }
            else {
              pcVar10 = p_00->pArray;
            }
            iVar9 = p_00->nSize;
            p_00->nSize = iVar9 + 1;
            pcVar10[iVar9] = cVar1;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
        }
        Bac_ManFindRealNameId(p,iVar11);
        Bac_ManWriteVar((Bac_Ntk_t *)p->pDesign->pStrs,(int)p->pDesign->vOut);
      }
    } while (iStart < iVar11);
  }
LAB_003a2250:
  uVar6 = p_00->nSize;
  if (uVar6 == p_00->nCap) {
    if ((int)uVar6 < 0x10) {
      if (p_00->pArray == (char *)0x0) {
        pcVar10 = (char *)malloc(0x10);
      }
      else {
        pcVar10 = (char *)realloc(p_00->pArray,0x10);
      }
      p_00->pArray = pcVar10;
      p_00->nCap = 0x10;
    }
    else {
      sVar4 = (ulong)uVar6 * 2;
      if (p_00->pArray == (char *)0x0) {
        pcVar10 = (char *)malloc(sVar4);
      }
      else {
        pcVar10 = (char *)realloc(p_00->pArray,sVar4);
      }
      p_00->pArray = pcVar10;
      p_00->nCap = (int)sVar4;
    }
  }
  else {
    pcVar10 = p_00->pArray;
  }
  iVar11 = p_00->nSize;
  p_00->nSize = iVar11 + 1;
  pcVar10[iVar11] = '}';
  return;
LAB_003a216b:
  if (uVar7 != 4) {
LAB_003a2408:
    __assert_fail("nBits == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x153,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  if (iVar11 != 0) {
    __assert_fail("Digit == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x154,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  goto LAB_003a223d;
}

Assistant:

static inline void Bac_ManWriteConcat( Bac_Ntk_t * p, int iStart, int nObjs )
{
    Vec_Str_t * vStr = p->pDesign->vOut; 
    assert( nObjs >= 1 );
    if ( nObjs == 1 )
    {
        Bac_ManWriteSig( p, iStart );
        return;
    }
    Vec_StrPrintStr( vStr, "{" );
    if ( Bac_ObjIsBo(p, iStart) ) // box output
    {
        int i;
        for ( i = iStart + nObjs - 1; i >= iStart; i-- )
        {
            if ( Bac_ObjNameType(p, i) == BAC_NAME_INDEX )
                continue;
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, i) );
        }
    }
    else if ( Bac_ObjIsBi(p, iStart) ) // box input
    {
        int e, b, k, NameId;
        for ( e = iStart - nObjs + 1; e <= iStart; )
        {
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            // write constant
            if ( Bac_ObjGetConst(p, Bac_ObjFanin(p, e)) )
            {
                int fBinary = Bac_ObjIsConstBin(p, Bac_ObjFanin(p, e)-1);                
                for ( b = e + 1; b <= iStart; b++ )
                {
                    if ( !Bac_ObjGetConst(p, Bac_ObjFanin(p, b)) )
                        break;
                    if ( !Bac_ObjIsConstBin(p, Bac_ObjFanin(p, b)-1) )
                        fBinary = 0;
                }
                Vec_StrPrintNum( vStr, b - e );
                if ( fBinary && b - e > 8 ) // write hex if more than 8 bits
                {
                    int Digit = 0, nBits = ((b - e) & 3) ? (b - e) & 3 : 4;
                    Vec_StrPrintStr( vStr, "\'h" );
                    for ( k = e; k < b; k++ )
                    {
                        Digit = 2*Digit + Bac_ObjGetConst(p, Bac_ObjFanin(p, k)) - BAC_BOX_CF;
                        assert( Digit < 16 );
                        if ( --nBits == 0 )
                        {
                            Vec_StrPush( vStr, (char)(Digit < 10 ? '0' + Digit : 'a' + Digit - 10) );
                            nBits = 4;
                            Digit = 0;
                        }
                    }
                    assert( nBits == 4 );
                    assert( Digit == 0 );
                }
                else
                {
                    Vec_StrPrintStr( vStr, "\'b" );
                    for ( k = e; k < b; k++ )
                        Bac_ManWriteConstBit( p, Bac_ObjFanin(p, k), 0 );
                }
                e = b;
                continue;
            }
            // try replication
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, b) != Bac_ObjFanin(p, e) )
                    break;
            if ( b > e + 2 ) // more than two
            {
                Vec_StrPrintNum( vStr, b - e );
                Vec_StrPrintStr( vStr, "{" );
                Bac_ManWriteSig( p, e );
                Vec_StrPrintStr( vStr, "}" );
                e = b;
                continue;
            }
            NameId = Bac_ObjName(p, Bac_ObjFanin(p, e));
            if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            {
                Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
                e++;
                continue;
            }
            // find end of the slice
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, e) - Bac_ObjFanin(p, b) != b - e )
                    break;
            // write signal name
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, Bac_ObjFanin(p, e)) );
            if ( b == e + 1 ) // literal
                Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)), -1 );
            else // slice or complete variable
            {
                // consider first variable of the slice
                int f = Bac_ObjFanin( p, b-1 );
                assert( Bac_ObjNameType(p, f) != BAC_NAME_BIN );
                if ( Bac_ObjNameType(p, f) == BAC_NAME_INDEX || Bac_ObjGetRange(p, f) != b - e ) // slice
                    Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, f), Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)) );
                // else this is complete variable
            }
            e = b;
        }
    }
    else assert( 0 );
    Vec_StrPrintStr( vStr, "}" );
}